

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.h
# Opt level: O0

Literal Clasp::DecisionHeuristic::selectLiteral(Solver *s,Var v,int signScore)

{
  bool bVar1;
  int iVar2;
  size_t *in_RCX;
  int in_EDX;
  uchar *sig;
  uint in_ESI;
  EVP_PKEY_CTX *ctx;
  undefined8 in_RDI;
  uchar *in_R8;
  size_t in_R9;
  ValueSet prefs;
  Solver *in_stack_ffffffffffffffd8;
  ValueSet local_19;
  int local_18;
  uint local_14;
  Var v_00;
  undefined4 in_stack_fffffffffffffff8;
  Literal in_stack_fffffffffffffffc;
  
  v_00 = (Var)((ulong)in_RDI >> 0x20);
  ctx = (EVP_PKEY_CTX *)(ulong)in_ESI;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_19 = Solver::pref(in_stack_ffffffffffffffd8,0);
  if (local_18 != 0) {
    ctx = (EVP_PKEY_CTX *)0x3f;
    bVar1 = ValueSet::has(&local_19,0x3f);
    if (!bVar1) {
      Literal::Literal((Literal *)&stack0xfffffffffffffffc,local_14,local_18 < 0);
      return (Literal)in_stack_fffffffffffffffc.rep_;
    }
  }
  bVar1 = ValueSet::empty(&local_19);
  if (bVar1) {
    in_stack_fffffffffffffffc =
         Solver::defaultLit((Solver *)
                            CONCAT44(in_stack_fffffffffffffffc.rep_,in_stack_fffffffffffffff8),v_00)
    ;
  }
  else {
    iVar2 = ValueSet::sign(&local_19,ctx,sig,in_RCX,in_R8,in_R9);
    Literal::Literal((Literal *)&stack0xfffffffffffffffc,local_14,(bool)((byte)iVar2 & 1));
  }
  return (Literal)in_stack_fffffffffffffffc.rep_;
}

Assistant:

static Literal selectLiteral(const Solver& s, Var v, int signScore) {
		ValueSet prefs = s.pref(v);
		if (signScore != 0 && !prefs.has(ValueSet::user_value | ValueSet::saved_value | ValueSet::pref_value)) {
			return Literal(v, signScore < 0);
		}
		else if (!prefs.empty()) {
			return Literal(v, prefs.sign());
		}
		return s.defaultLit(v);
	}